

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

void __thiscall args::ArgumentParser::Help(ArgumentParser *this,ostream *help_)

{
  char cVar1;
  bool bVar2;
  byte bVar3;
  ostream *poVar4;
  size_type sVar5;
  long lVar6;
  uint uVar7;
  char *pcVar8;
  pointer pbVar9;
  _Alloc_hider _Var10;
  pointer pbVar11;
  int iVar12;
  ArgumentParser *pAVar13;
  string *posname;
  undefined1 local_298 [32];
  ArgumentParser *local_278;
  allocator local_26a;
  allocator local_269;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  flags;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  int *local_200;
  int *local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  proglines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  epilog_text;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  description_text;
  ostringstream prognameline;
  
  Wrap(&description_text,&this->description,
       (ulong)((this->helpParams).width - (this->helpParams).descriptionindent),0);
  Wrap(&epilog_text,&this->epilog,
       (ulong)((this->helpParams).width - (this->helpParams).descriptionindent),0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&prognameline);
  std::operator<<((ostream *)&prognameline,(string *)&this->prog);
  bVar2 = Group::HasFlag(&this->super_Group);
  if ((bVar2) && ((this->helpParams).showProglineOptions == true)) {
    std::operator<<((ostream *)&prognameline," {OPTIONS}");
  }
  local_278 = this;
  Group::GetPosNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_298,&this->super_Group);
  bVar3 = 0;
  for (pbVar9 = (pointer)local_298._0_8_; pbVar9 != (pointer)local_298._8_8_; pbVar9 = pbVar9 + 1) {
    if ((local_278->helpParams).showProglinePositionals == true) {
      poVar4 = std::operator<<((ostream *)&prognameline," [");
      poVar4 = std::operator<<(poVar4,(string *)pbVar9);
      std::operator<<(poVar4,']');
    }
    bVar3 = 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_298);
  pAVar13 = local_278;
  if ((local_278->proglinePostfix)._M_string_length != 0) {
    poVar4 = std::operator<<((ostream *)&prognameline,' ');
    std::operator<<(poVar4,(string *)&pAVar13->proglinePostfix);
  }
  std::__cxx11::stringbuf::str();
  uVar7 = (pAVar13->helpParams).width - (pAVar13->helpParams).progindent;
  Wrap(&proglines,(string *)local_298,(ulong)(uVar7 - 4),(ulong)uVar7);
  std::__cxx11::string::~string((string *)local_298);
  pbVar9 = proglines.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (proglines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      proglines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_298._0_8_ = local_298 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_298,(char)(pAVar13->helpParams).progindent);
    poVar4 = std::operator<<(help_,(string *)local_298);
    poVar4 = std::operator<<(poVar4,(string *)
                                    proglines.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
    std::operator<<(poVar4,'\n');
    std::__cxx11::string::~string((string *)local_298);
    pbVar9 = proglines.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
  }
  for (; pbVar9 != proglines.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 1) {
    local_298._0_8_ = local_298 + 0x10;
    std::__cxx11::string::_M_construct
              ((ulong)local_298,(char)(local_278->helpParams).progtailindent);
    poVar4 = std::operator<<(help_,(string *)local_298);
    poVar4 = std::operator<<(poVar4,(string *)pbVar9);
    std::operator<<(poVar4,'\n');
    std::__cxx11::string::~string((string *)local_298);
  }
  std::operator<<(help_,'\n');
  for (pbVar9 = description_text.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar9 != description_text.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 1) {
    local_298._0_8_ = local_298 + 0x10;
    std::__cxx11::string::_M_construct
              ((ulong)local_298,(char)(local_278->helpParams).descriptionindent);
    poVar4 = std::operator<<(help_,(string *)local_298);
    poVar4 = std::operator<<(poVar4,(string *)pbVar9);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string((string *)local_298);
  }
  std::operator<<(help_,"\n");
  pAVar13 = local_278;
  local_298._0_8_ = local_298 + 0x10;
  std::__cxx11::string::_M_construct((ulong)local_298,(char)(local_278->helpParams).progindent);
  poVar4 = std::operator<<(help_,(string *)local_298);
  std::operator<<(poVar4,"OPTIONS:\n\n");
  std::__cxx11::string::~string((string *)local_298);
  pcVar8 = " ";
  if (pAVar13->allowJoinedShortValue != false) {
    pcVar8 = "";
  }
  std::__cxx11::string::string((string *)local_298,pcVar8,(allocator *)&info);
  if (pAVar13->allowJoinedLongValue == true) {
    std::__cxx11::string::string((string *)&flags,(string *)&pAVar13->longseparator);
  }
  else {
    std::__cxx11::string::string((string *)&flags," ",&local_269);
  }
  Group::GetChildDescriptions
            ((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)&local_220,&pAVar13->super_Group,&pAVar13->shortprefix,&pAVar13->longprefix,
             (string *)local_298,(string *)&flags,0);
  std::__cxx11::string::~string((string *)&flags);
  std::__cxx11::string::~string((string *)local_298);
  local_200 = (int *)local_220._M_string_length;
  _Var10._M_p = local_220._M_dataplus._M_p;
  while( true ) {
    if ((int *)_Var10._M_p == local_200) {
      std::
      vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 *)&local_220);
      if (((bVar2 & bVar3) != 0) && ((pAVar13->helpParams).showTerminator == true)) {
        std::__cxx11::string::string((string *)&local_220,"\"",&local_26a);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flags,
                       &local_220,&pAVar13->terminator);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_298,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flags,
                       "\" can be used to terminate flag options and force all following arguments to be treated as positional options"
                      );
        Wrap(&info,(string *)local_298,
             (ulong)((pAVar13->helpParams).width - (pAVar13->helpParams).flagindent),0);
        std::__cxx11::string::~string((string *)local_298);
        std::__cxx11::string::~string((string *)&flags);
        std::__cxx11::string::~string((string *)&local_220);
        for (pbVar9 = info.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pbVar9 != info.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 1) {
          local_298._0_8_ = local_298 + 0x10;
          std::__cxx11::string::_M_construct
                    ((ulong)local_298,(char)(local_278->helpParams).flagindent);
          poVar4 = std::operator<<(help_,(string *)local_298);
          poVar4 = std::operator<<(poVar4,(string *)pbVar9);
          std::operator<<(poVar4,'\n');
          std::__cxx11::string::~string((string *)local_298);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&info);
      }
      std::operator<<(help_,"\n");
      for (pbVar9 = epilog_text.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar9 != epilog_text.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 1) {
        local_298._0_8_ = local_298 + 0x10;
        std::__cxx11::string::_M_construct
                  ((ulong)local_298,(char)(local_278->helpParams).descriptionindent);
        poVar4 = std::operator<<(help_,(string *)local_298);
        poVar4 = std::operator<<(poVar4,(string *)pbVar9);
        std::operator<<(poVar4,"\n");
        std::__cxx11::string::~string((string *)local_298);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&proglines);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&prognameline);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&epilog_text);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&description_text);
      return;
    }
    iVar12 = (pAVar13->helpParams).eachgroupindent * *(int *)_Var10._M_p;
    Wrap(&flags,(string *)((long)_Var10._M_p + 0x28),
         (ulong)((pAVar13->helpParams).width -
                ((pAVar13->helpParams).flagindent + (pAVar13->helpParams).helpindent +
                (pAVar13->helpParams).gutter)),0);
    local_1f8 = (int *)_Var10._M_p;
    Wrap(&info,(string *)((long)_Var10._M_p + 8),
         (ulong)((pAVar13->helpParams).width - ((pAVar13->helpParams).helpindent + iVar12)),0);
    sVar5 = 0;
    for (pbVar9 = flags.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar11 = info.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start, cVar1 = (char)iVar12,
        pbVar9 != flags.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 1) {
      if (pbVar9 != flags.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
        std::operator<<(help_,'\n');
      }
      local_298._0_8_ = local_298 + 0x10;
      std::__cxx11::string::_M_construct
                ((ulong)local_298,(char)(local_278->helpParams).flagindent + cVar1);
      poVar4 = std::operator<<(help_,(string *)local_298);
      std::operator<<(poVar4,(string *)pbVar9);
      std::__cxx11::string::~string((string *)local_298);
      sVar5 = Glyphs(pbVar9);
    }
    uVar7 = (local_278->helpParams).helpindent;
    lVar6 = sVar5 + (local_278->helpParams).flagindent;
    if (((ulong)uVar7 < (ulong)(local_278->helpParams).gutter + lVar6) ||
       (info.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        info.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) break;
    local_298._0_8_ = local_298 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_298,(char)uVar7 - (char)lVar6);
    poVar4 = std::operator<<(help_,(string *)local_298);
    poVar4 = std::operator<<(poVar4,(string *)pbVar11);
    std::operator<<(poVar4,'\n');
    while( true ) {
      std::__cxx11::string::~string((string *)local_298);
      pbVar11 = pbVar11 + 1;
LAB_00109195:
      if (pbVar11 ==
          info.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) break;
      local_298._0_8_ = local_298 + 0x10;
      std::__cxx11::string::_M_construct
                ((ulong)local_298,(char)(local_278->helpParams).helpindent + cVar1);
      poVar4 = std::operator<<(help_,(string *)local_298);
      poVar4 = std::operator<<(poVar4,(string *)pbVar11);
      std::operator<<(poVar4,'\n');
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&info);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&flags);
    _Var10._M_p = (pointer)(local_1f8 + 0x12);
    pAVar13 = local_278;
  }
  std::operator<<(help_,'\n');
  goto LAB_00109195;
}

Assistant:

void Help(std::ostream &help_) const
            {
                bool hasoptions = false;
                bool hasarguments = false;

                const auto description_text = Wrap(this->description, helpParams.width - helpParams.descriptionindent);
                const auto epilog_text = Wrap(this->epilog, helpParams.width - helpParams.descriptionindent);
                std::ostringstream prognameline;
                prognameline << prog;
                if (HasFlag())
                {
                    hasoptions = true;
                    if (helpParams.showProglineOptions)
                    {
                        prognameline << " {OPTIONS}";
                    }
                }
                for (const std::string &posname: GetPosNames())
                {
                    hasarguments = true;
                    if (helpParams.showProglinePositionals)
                    {
                        prognameline << " [" << posname << ']';
                    }
                }
                if (!proglinePostfix.empty())
                {
                    prognameline << ' ' << proglinePostfix;
                }
                const auto proglines = Wrap(prognameline.str(), helpParams.width - (helpParams.progindent + 4), helpParams.width - helpParams.progindent);
                auto progit = std::begin(proglines);
                if (progit != std::end(proglines))
                {
                    help_ << std::string(helpParams.progindent, ' ') << *progit << '\n';
                    ++progit;
                }
                for (; progit != std::end(proglines); ++progit)
                {
                    help_ << std::string(helpParams.progtailindent, ' ') << *progit << '\n';
                }

                help_ << '\n';

                for (const auto &line: description_text)
                {
                    help_ << std::string(helpParams.descriptionindent, ' ') << line << "\n";
                }
                help_ << "\n";
                help_ << std::string(helpParams.progindent, ' ') << "OPTIONS:\n\n";
                for (const auto &desc: GetChildDescriptions(shortprefix, longprefix, allowJoinedShortValue ? "" : " ", allowJoinedLongValue ? longseparator : " "))
                {
                    const auto groupindent = std::get<2>(desc) * helpParams.eachgroupindent;
                    const auto flags = Wrap(std::get<0>(desc), helpParams.width - (helpParams.flagindent + helpParams.helpindent + helpParams.gutter));
                    const auto info = Wrap(std::get<1>(desc), helpParams.width - (helpParams.helpindent + groupindent));

                    std::string::size_type flagssize = 0;
                    for (auto flagsit = std::begin(flags); flagsit != std::end(flags); ++flagsit)
                    {
                        if (flagsit != std::begin(flags))
                        {
                            help_ << '\n';
                        }
                        help_ << std::string(groupindent + helpParams.flagindent, ' ') << *flagsit;
                        flagssize = Glyphs(*flagsit);
                    }

                    auto infoit = std::begin(info);
                    // groupindent is on both sides of this inequality, and therefore can be removed
                    if ((helpParams.flagindent + flagssize + helpParams.gutter) > helpParams.helpindent || infoit == std::end(info))
                    {
                        help_ << '\n';
                    } else
                    {
                        // groupindent is on both sides of the minus sign, and therefore doesn't actually need to be in here
                        help_ << std::string(helpParams.helpindent - (helpParams.flagindent + flagssize), ' ') << *infoit << '\n';
                        ++infoit;
                    }
                    for (; infoit != std::end(info); ++infoit)
                    {
                        help_ << std::string(groupindent + helpParams.helpindent, ' ') << *infoit << '\n';
                    }
                }
                if (hasoptions && hasarguments && helpParams.showTerminator)
                {
                    for (const auto &item: Wrap(std::string("\"") + terminator + "\" can be used to terminate flag options and force all following arguments to be treated as positional options", helpParams.width - helpParams.flagindent))
                    {
                        help_ << std::string(helpParams.flagindent, ' ') << item << '\n';
                    }
                }

                help_ << "\n";
                for (const auto &line: epilog_text)
                {
                    help_ << std::string(helpParams.descriptionindent, ' ') << line << "\n";
                }
            }